

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,Script *script,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  string local_a0;
  AddressType local_7c;
  CfdSourceLocation local_78;
  string local_60;
  allocator local_29;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_28;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  Script *script_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  this->type_ = type;
  this->addr_type_ = kP2wshAddress;
  this->witness_ver_ = witness_ver;
  local_28 = network_parameters;
  network_parameters_local =
       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)script
  ;
  script_local._0_4_ = witness_ver;
  script_local._4_4_ = type;
  _witness_ver_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_,(Script *)network_parameters_local);
  GetTargetFormatData(&this->format_data_,local_28,script_local._4_4_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  SetNetType(this,&this->format_data_);
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_60,&this->format_data_);
  CalculateP2WSH(this,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0x213;
  local_78.funcname = "Address";
  local_7c = kP2wshAddress;
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_a0,&this->format_data_);
  logger::info<cfd::core::NetType&,cfd::core::AddressType,std::__cxx11::string>
            (&local_78,"call Address({},{},{})",&this->type_,&local_7c,&local_a0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const Script& script,
    const std::vector<AddressFormatData>& network_parameters)
    : type_(type),
      addr_type_(AddressType::kP2wshAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_(script),
      format_data_(GetTargetFormatData(network_parameters, type)) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  CalculateP2WSH(format_data_.GetBech32Hrp());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_,
      AddressType::kP2wshAddress, format_data_.GetBech32Hrp());
}